

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_cs.c
# Opt level: O0

int jpc_putuint32(jas_stream_t *out,uint_fast32_t val)

{
  byte *pbVar1;
  byte bVar2;
  int iVar3;
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  uint local_30;
  uint local_2c;
  uint local_28;
  uint local_24;
  uint_fast32_t val_local;
  jas_stream_t *out_local;
  
  if ((out->flags_ & 7U) == 0) {
    if ((out->rwlimit_ < 0) || (out->rwcnt_ < out->rwlimit_)) {
      out->bufmode_ = out->bufmode_ | 0x20;
      iVar3 = out->cnt_ + -1;
      out->cnt_ = iVar3;
      bVar2 = (byte)(val >> 0x18);
      if (iVar3 < 0) {
        local_28 = jas_stream_flushbuf(out,(uint)bVar2);
      }
      else {
        out->rwcnt_ = out->rwcnt_ + 1;
        pbVar1 = out->ptr_;
        out->ptr_ = pbVar1 + 1;
        *pbVar1 = bVar2;
        local_28 = (uint)bVar2;
      }
      local_24 = local_28;
    }
    else {
      out->flags_ = out->flags_ | 4;
      local_24 = 0xffffffff;
    }
    local_2c = local_24;
  }
  else {
    local_2c = 0xffffffff;
  }
  if (local_2c != 0xffffffff) {
    if ((out->flags_ & 7U) == 0) {
      if ((out->rwlimit_ < 0) || (out->rwcnt_ < out->rwlimit_)) {
        out->bufmode_ = out->bufmode_ | 0x20;
        iVar3 = out->cnt_ + -1;
        out->cnt_ = iVar3;
        bVar2 = (byte)(val >> 0x10);
        if (iVar3 < 0) {
          local_34 = jas_stream_flushbuf(out,(uint)bVar2);
        }
        else {
          out->rwcnt_ = out->rwcnt_ + 1;
          pbVar1 = out->ptr_;
          out->ptr_ = pbVar1 + 1;
          *pbVar1 = bVar2;
          local_34 = (uint)bVar2;
        }
        local_30 = local_34;
      }
      else {
        out->flags_ = out->flags_ | 4;
        local_30 = 0xffffffff;
      }
      local_38 = local_30;
    }
    else {
      local_38 = 0xffffffff;
    }
    if (local_38 != 0xffffffff) {
      if ((out->flags_ & 7U) == 0) {
        if ((out->rwlimit_ < 0) || (out->rwcnt_ < out->rwlimit_)) {
          out->bufmode_ = out->bufmode_ | 0x20;
          iVar3 = out->cnt_ + -1;
          out->cnt_ = iVar3;
          bVar2 = (byte)(val >> 8);
          if (iVar3 < 0) {
            local_40 = jas_stream_flushbuf(out,(uint)bVar2);
          }
          else {
            out->rwcnt_ = out->rwcnt_ + 1;
            pbVar1 = out->ptr_;
            out->ptr_ = pbVar1 + 1;
            *pbVar1 = bVar2;
            local_40 = (uint)bVar2;
          }
          local_3c = local_40;
        }
        else {
          out->flags_ = out->flags_ | 4;
          local_3c = 0xffffffff;
        }
        local_44 = local_3c;
      }
      else {
        local_44 = 0xffffffff;
      }
      if (local_44 != 0xffffffff) {
        if ((out->flags_ & 7U) == 0) {
          if ((out->rwlimit_ < 0) || (out->rwcnt_ < out->rwlimit_)) {
            out->bufmode_ = out->bufmode_ | 0x20;
            iVar3 = out->cnt_ + -1;
            out->cnt_ = iVar3;
            bVar2 = (byte)val;
            if (iVar3 < 0) {
              local_4c = jas_stream_flushbuf(out,(uint)bVar2);
            }
            else {
              out->rwcnt_ = out->rwcnt_ + 1;
              pbVar1 = out->ptr_;
              out->ptr_ = pbVar1 + 1;
              *pbVar1 = bVar2;
              local_4c = (uint)bVar2;
            }
            local_48 = local_4c;
          }
          else {
            out->flags_ = out->flags_ | 4;
            local_48 = 0xffffffff;
          }
          local_50 = local_48;
        }
        else {
          local_50 = 0xffffffff;
        }
        if (local_50 != 0xffffffff) {
          return 0;
        }
      }
    }
  }
  return -1;
}

Assistant:

int jpc_putuint32(jas_stream_t *out, uint_fast32_t val)
{
	if (jas_stream_putc(out, (val >> 24) & 0xff) == EOF ||
	  jas_stream_putc(out, (val >> 16) & 0xff) == EOF ||
	  jas_stream_putc(out, (val >> 8) & 0xff) == EOF ||
	  jas_stream_putc(out, val & 0xff) == EOF) {
		return -1;
	}
	return 0;
}